

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O0

ostream * tchecker::dbm::output(ostream *os,db_t *db)

{
  db_t *pdVar1;
  bool bVar2;
  integer_t iVar3;
  ostream *this;
  db_t *db_00;
  string local_38;
  db_t *local_18;
  db_t *db_local;
  ostream *os_local;
  
  local_18 = db;
  db_local = (db_t *)os;
  bVar2 = operator==(db,(db_t *)&LT_INFINITY);
  pdVar1 = db_local;
  if (bVar2) {
    std::operator<<((ostream *)db_local,"<inf");
  }
  else {
    comparator_str_abi_cxx11_(&local_38,(dbm *)local_18,db_00);
    this = std::operator<<((ostream *)pdVar1,(string *)&local_38);
    iVar3 = value(local_18);
    std::ostream::operator<<(this,iVar3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (ostream *)db_local;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const & db)
{
  if (db == tchecker::dbm::LT_INFINITY)
    os << "<inf";
  else
    os << tchecker::dbm::comparator_str(db) << tchecker::dbm::value(db);
  return os;
}